

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

char * whisper_model_type_readable(whisper_context *ctx)

{
  uint uVar1;
  
  uVar1 = (ctx->model).type - MODEL_TINY;
  if (uVar1 < 5) {
    return &DAT_0015aa20 + *(int *)(&DAT_0015aa20 + (ulong)uVar1 * 4);
  }
  return "unknown";
}

Assistant:

const char *whisper_model_type_readable(struct whisper_context * ctx) {
    switch (ctx->model.type) {
    case e_model::MODEL_TINY:
        return "tiny";
    case e_model::MODEL_BASE:
        return "base";
    case e_model::MODEL_SMALL:
        return "small";
    case e_model::MODEL_MEDIUM:
        return "medium";
    case e_model::MODEL_LARGE:
        return "large";
    default:
        return "unknown";
    }
}